

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O3

bool __thiscall crnlib::crn_comp::alias_images(crn_comp *this)

{
  bool bVar1;
  uint uVar2;
  crn_uint32 cVar3;
  color_quad<unsigned_char,_int> *pcVar4;
  color_quad<unsigned_char,_int> *p;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  conversion_type conv_type;
  crn_comp_params *pcVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  pixel_buf_t *ppVar12;
  pixel_buf_t *ppVar13;
  uint *puVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  image<crnlib::color_quad<unsigned_char,_int>_> *other;
  image<crnlib::color_quad<unsigned_char,_int>_> *local_80;
  image<crnlib::color_quad<unsigned_char,_int>_> local_68;
  
  pcVar8 = this->m_pParams;
  if (pcVar8->m_faces != 0) {
    ppVar12 = &this->m_images[0][0].m_pixel_buf;
    local_80 = (image<crnlib::color_quad<unsigned_char,_int>_> *)0x28;
    uVar9 = 0;
    do {
      if (pcVar8->m_levels != 0) {
        uVar16 = 0;
        ppVar13 = ppVar12;
        do {
          uVar17 = pcVar8->m_width >> ((byte)uVar16 & 0x1f);
          uVar18 = uVar17 + (uVar17 == 0);
          uVar17 = pcVar8->m_height >> ((byte)uVar16 & 0x1f);
          uVar15 = uVar17 + (uVar17 == 0);
          pcVar4 = *(color_quad<unsigned_char,_int> **)
                    ((long)(pcVar8->m_pImages + -1) + 0x58 + uVar16 * 8 + (long)local_80);
          if (pcVar4 == (color_quad<unsigned_char,_int> *)0x0) {
            return false;
          }
          if (ppVar13->m_p != (color_quad<unsigned_char,_int> *)0x0) {
            crnlib_free(ppVar13->m_p);
            ppVar13->m_p = (color_quad<unsigned_char,_int> *)0x0;
            ppVar13->m_size = 0;
            ppVar13->m_capacity = 0;
            pcVar8 = this->m_pParams;
          }
          *(color_quad<unsigned_char,_int> **)((long)(ppVar13 + -1) + 8) = pcVar4;
          ((image_u8 *)(ppVar13 + -2))->m_width = uVar18;
          ((image_u8 *)(ppVar13 + -2))->m_height = uVar15;
          ((image_u8 *)(ppVar13 + -2))->m_pitch = uVar18;
          ((image_u8 *)(ppVar13 + -2))->m_total = uVar15 * uVar18;
          *(uint *)(ppVar13 + -1) = 0xf;
          uVar16 = uVar16 + 1;
          ppVar13 = ppVar13 + 3;
        } while (uVar16 < pcVar8->m_levels);
      }
      uVar9 = uVar9 + 1;
      local_80 = (image<crnlib::color_quad<unsigned_char,_int>_> *)((long)local_80 + 0x80);
      ppVar12 = ppVar12 + 0x30;
    } while (uVar9 < pcVar8->m_faces);
  }
  conv_type = image_utils::get_image_conversion_type_from_crn_format(pcVar8->m_format);
  pcVar8 = this->m_pParams;
  if ((conv_type != cConversion_Invalid) && (pcVar8->m_faces != 0)) {
    local_80 = this->m_images[0];
    uVar9 = 0;
    do {
      if (pcVar8->m_levels != 0) {
        uVar16 = 0;
        other = local_80;
        do {
          image<crnlib::color_quad<unsigned_char,_int>_>::image(&local_68,other);
          image_utils::convert_image(&local_68,conv_type);
          uVar6._0_4_ = other->m_width;
          uVar6._4_4_ = other->m_height;
          uVar7._0_4_ = other->m_pitch;
          uVar7._4_4_ = other->m_total;
          other->m_width = local_68.m_width;
          other->m_height = local_68.m_height;
          other->m_pitch = local_68.m_pitch;
          other->m_total = local_68.m_total;
          uVar15 = other->m_comp_flags;
          other->m_comp_flags = local_68.m_comp_flags;
          pcVar4 = other->m_pPixels;
          p = (other->m_pixel_buf).m_p;
          other->m_pPixels = local_68.m_pPixels;
          (other->m_pixel_buf).m_p = local_68.m_pixel_buf.m_p;
          uVar5._0_4_ = (other->m_pixel_buf).m_size;
          uVar5._4_4_ = (other->m_pixel_buf).m_capacity;
          (other->m_pixel_buf).m_size = local_68.m_pixel_buf.m_size;
          (other->m_pixel_buf).m_capacity = local_68.m_pixel_buf.m_capacity;
          local_68._0_8_ = uVar6;
          local_68._8_8_ = uVar7;
          local_68.m_comp_flags = uVar15;
          local_68.m_pPixels = pcVar4;
          local_68.m_pixel_buf.m_p = p;
          local_68.m_pixel_buf._8_8_ = uVar5;
          if (p != (color_quad<unsigned_char,_int> *)0x0) {
            crnlib_free(p);
          }
          uVar16 = uVar16 + 1;
          pcVar8 = this->m_pParams;
          other = other + 1;
        } while (uVar16 < pcVar8->m_levels);
      }
      uVar9 = uVar9 + 1;
      local_80 = local_80 + 0x10;
    } while (uVar9 < pcVar8->m_faces);
  }
  uVar17 = pcVar8->m_levels;
  uVar2 = (this->m_levels).m_size;
  uVar10 = uVar17;
  if (uVar2 != uVar17) {
    if ((uVar2 <= uVar17) && ((this->m_levels).m_capacity < uVar17)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_levels,uVar17,uVar2 + 1 == uVar17,0xc,
                 (object_mover)0x0,false);
      pcVar8 = this->m_pParams;
      uVar10 = pcVar8->m_levels;
    }
    (this->m_levels).m_size = uVar17;
  }
  this->m_total_blocks = 0;
  if (uVar10 != 0) {
    uVar17 = pcVar8->m_height;
    cVar3 = pcVar8->m_faces;
    uVar2 = pcVar8->m_width;
    bVar1 = this->m_has_subblocks;
    puVar14 = &((this->m_levels).m_p)->block_width;
    uVar9 = 0;
    uVar15 = 0;
    do {
      uVar11 = uVar17 >> ((byte)uVar9 & 0x1f);
      uVar19 = uVar2 >> ((byte)uVar9 & 0x1f);
      uVar19 = (uVar19 + 7 + (uint)(uVar19 == 0) & 0xfffffff8) >> (2U - bVar1 & 0x1f);
      *puVar14 = uVar19;
      ((level_details *)(puVar14 + -2))->first_block = uVar15;
      uVar18 = (uVar11 + 7 + (uint)(uVar11 == 0) >> 2 & 0xfffffffe) * cVar3 * uVar19;
      puVar14[-1] = uVar18;
      uVar15 = uVar18 + uVar15;
      uVar9 = uVar9 + 1;
      puVar14 = puVar14 + 3;
    } while (uVar10 != uVar9);
    this->m_total_blocks = uVar15;
  }
  return true;
}

Assistant:

bool crn_comp::alias_images()
    {
        for (uint face_index = 0; face_index < m_pParams->m_faces; face_index++)
        {
            for (uint level_index = 0; level_index < m_pParams->m_levels; level_index++)
            {
                const uint width = math::maximum(1U, m_pParams->m_width >> level_index);
                const uint height = math::maximum(1U, m_pParams->m_height >> level_index);
                if (!m_pParams->m_pImages[face_index][level_index])
                {
                    return false;
                }
                m_images[face_index][level_index].alias((color_quad_u8*)m_pParams->m_pImages[face_index][level_index], width, height);
            }
        }

        image_utils::conversion_type conv_type = image_utils::get_image_conversion_type_from_crn_format((crn_format)m_pParams->m_format);
        if (conv_type != image_utils::cConversion_Invalid)
        {
            for (uint face_index = 0; face_index < m_pParams->m_faces; face_index++)
            {
                for (uint level_index = 0; level_index < m_pParams->m_levels; level_index++)
                {
                    image_u8 cooked_image(m_images[face_index][level_index]);
                    image_utils::convert_image(cooked_image, conv_type);
                    m_images[face_index][level_index].swap(cooked_image);
                }
            }
        }

        m_levels.resize(m_pParams->m_levels);
        m_total_blocks = 0;
        for (uint level = 0; level < m_pParams->m_levels; level++)
        {
            uint blockHeight = ((math::maximum(1U, m_pParams->m_height >> level) + 7) & ~7) >> 2;
            m_levels[level].block_width = ((math::maximum(1U, m_pParams->m_width >> level) + 7) & ~7) >> (m_has_subblocks ? 1 : 2);
            m_levels[level].first_block = m_total_blocks;
            m_levels[level].num_blocks = m_pParams->m_faces * m_levels[level].block_width * blockHeight;
            m_total_blocks += m_levels[level].num_blocks;
        }

        return true;
    }